

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O0

KFLOAT32 * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::operator[](PerimeterPointCoordinate *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  PerimeterPointCoordinate *pPStack_18;
  KUINT16 i_local;
  PerimeterPointCoordinate *this_local;
  
  if (i == 0) {
    this_local = (PerimeterPointCoordinate *)&this->m_f32X;
  }
  else {
    if (i != 1) {
      local_1a = i;
      pPStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (PerimeterPointCoordinate *)&this->m_f32Y;
  }
  return (KFLOAT32 *)this_local;
}

Assistant:

const KFLOAT32 &PerimeterPointCoordinate::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_f32X;
    case 1:
        return m_f32Y;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}